

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cepstrum_to_autocorrelation.cc
# Opt level: O2

bool __thiscall
sptk::CepstrumToAutocorrelation::Run
          (CepstrumToAutocorrelation *this,vector<double,_std::allocator<double>_> *cepstrum,
          vector<double,_std::allocator<double>_> *autocorrelation,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  size_type __new_size;
  int iVar1;
  int iVar2;
  pointer pdVar3;
  double *pdVar4;
  bool bVar5;
  pointer pdVar6;
  size_t __n;
  double *pdVar7;
  long lVar8;
  double dVar9;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if (((buffer != (Buffer *)0x0) &&
      (autocorrelation != (vector<double,_std::allocator<double>_> *)0x0)) &&
     (lVar8 = (long)(cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3, lVar8 == (long)this->num_input_order_ + 1
     )) {
    iVar1 = this->num_output_order_;
    __new_size = (long)iVar1 + 1;
    if ((long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(autocorrelation,__new_size);
    }
    iVar2 = (this->fast_fourier_transform_).fft_length_;
    this_00 = &buffer->real_part_;
    pdVar6 = (buffer->real_part_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(buffer->real_part_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pdVar6 >> 3 != (long)iVar2) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,(long)iVar2);
      pdVar6 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    pdVar3 = (cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __n = (long)(cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar3;
    if (__n != 0) {
      memmove(pdVar6,pdVar3,__n);
      pdVar6 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    pdVar3 = (buffer->real_part_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar6 = pdVar6 + lVar8; pdVar6 != pdVar3; pdVar6 = pdVar6 + 1) {
      *pdVar6 = 0.0;
    }
    bVar5 = RealValuedFastFourierTransform::Run
                      (&this->fast_fourier_transform_,this_00,&buffer->imag_part_,
                       &buffer->buffer_for_fast_fourier_transform_);
    if (bVar5) {
      pdVar4 = (buffer->real_part_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar7 = (buffer->real_part_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start; pdVar7 != pdVar4; pdVar7 = pdVar7 + 1) {
        dVar9 = exp(*pdVar7 + *pdVar7);
        *pdVar7 = dVar9;
      }
      bVar5 = RealValuedFastFourierTransform::Run
                        (&this->fast_fourier_transform_,this_00,&buffer->imag_part_,
                         &buffer->buffer_for_fast_fourier_transform_);
      if (bVar5) {
        pdVar6 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar8 = 0; (long)iVar1 * 8 + 8 != lVar8; lVar8 = lVar8 + 8) {
          *(double *)((long)pdVar3 + lVar8) =
               *(double *)((long)pdVar6 + lVar8) * (1.0 / (double)iVar2);
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool CepstrumToAutocorrelation::Run(
    const std::vector<double>& cepstrum, std::vector<double>* autocorrelation,
    CepstrumToAutocorrelation::Buffer* buffer) const {
  // Check inputs.
  const int input_length(num_input_order_ + 1);
  if (!is_valid_ || cepstrum.size() != static_cast<std::size_t>(input_length) ||
      NULL == autocorrelation || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(num_output_order_ + 1);
  if (autocorrelation->size() != static_cast<std::size_t>(output_length)) {
    autocorrelation->resize(output_length);
  }
  const int fft_length(fast_fourier_transform_.GetFftLength());
  if (buffer->real_part_.size() != static_cast<std::size_t>(fft_length)) {
    buffer->real_part_.resize(fft_length);
  }

  std::copy(cepstrum.begin(), cepstrum.end(), buffer->real_part_.begin());
  std::fill(buffer->real_part_.begin() + input_length, buffer->real_part_.end(),
            0.0);

  if (!fast_fourier_transform_.Run(
          &buffer->real_part_, &buffer->imag_part_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  std::transform(buffer->real_part_.begin(), buffer->real_part_.end(),
                 buffer->real_part_.begin(),
                 [](double x) { return std::exp(2.0 * x); });

  if (!fast_fourier_transform_.Run(
          &buffer->real_part_, &buffer->imag_part_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  const double z(1.0 / fft_length);
  std::transform(buffer->real_part_.begin(),
                 buffer->real_part_.begin() + output_length,
                 autocorrelation->begin(), [z](double x) { return x * z; });

  return true;
}